

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

Statement *
slang::ast::ExpressionStatement::fromSyntax
          (Compilation *compilation,VoidCastedCallStatementSyntax *syntax,ASTContext *context)

{
  Expression *__addr;
  VoidCastedCallStatementSyntax *this;
  bool bVar1;
  int iVar2;
  SubroutineKind SVar3;
  ExpressionSyntax *pEVar4;
  undefined4 extraout_var;
  Statement *pSVar5;
  CallExpression *pCVar6;
  Type *pTVar7;
  Diagnostic *this_00;
  string_view arg;
  SourceRange local_50;
  Compilation *local_40;
  ExpressionStatement *result;
  Expression *local_30;
  Expression *expr;
  ASTContext *context_local;
  VoidCastedCallStatementSyntax *syntax_local;
  Compilation *compilation_local;
  
  expr = (Expression *)context;
  context_local = (ASTContext *)syntax;
  syntax_local = (VoidCastedCallStatementSyntax *)compilation;
  pEVar4 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&syntax->expr);
  __addr = expr;
  bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&result,None);
  iVar2 = Expression::bind((int)pEVar4,(sockaddr *)__addr,(socklen_t)result);
  this = syntax_local;
  local_30 = (Expression *)CONCAT44(extraout_var,iVar2);
  local_50 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)context_local);
  local_40 = (Compilation *)
             BumpAllocator::
             emplace<slang::ast::ExpressionStatement,slang::ast::Expression_const&,slang::SourceRange>
                       ((BumpAllocator *)this,(Expression *)CONCAT44(extraout_var,iVar2),&local_50);
  bVar1 = Expression::bad(local_30);
  if (bVar1) {
    pSVar5 = Statement::badStmt((Compilation *)syntax_local,(Statement *)local_40);
    return pSVar5;
  }
  if (local_30->kind == Call) {
    pCVar6 = Expression::as<slang::ast::CallExpression>(local_30);
    SVar3 = CallExpression::getSubroutineKind(pCVar6);
    if (SVar3 == Task) {
      pTVar7 = not_null<const_slang::ast::Type_*>::operator->(&local_30->type);
      bVar1 = Type::isVoid(pTVar7);
      if (bVar1) goto LAB_0044e66f;
    }
    pTVar7 = not_null<const_slang::ast::Type_*>::operator->(&local_30->type);
    bVar1 = Type::isVoid(pTVar7);
    if (bVar1) {
      this_00 = ASTContext::addDiag((ASTContext *)expr,(DiagCode)0x500008,local_30->sourceRange);
      pCVar6 = Expression::as<slang::ast::CallExpression>(local_30);
      arg = CallExpression::getSubroutineName(pCVar6);
      Diagnostic::operator<<(this_00,arg);
    }
    compilation_local = local_40;
  }
  else {
LAB_0044e66f:
    ASTContext::addDiag((ASTContext *)expr,(DiagCode)0x4a0008,local_30->sourceRange);
    compilation_local =
         (Compilation *)Statement::badStmt((Compilation *)syntax_local,(Statement *)local_40);
  }
  return (Statement *)compilation_local;
}

Assistant:

Statement& ExpressionStatement::fromSyntax(Compilation& compilation,
                                           const VoidCastedCallStatementSyntax& syntax,
                                           const ASTContext& context) {
    auto& expr = Expression::bind(*syntax.expr, context);
    auto result = compilation.emplace<ExpressionStatement>(expr, syntax.sourceRange());
    if (expr.bad())
        return badStmt(compilation, result);

    if (expr.kind != ExpressionKind::Call ||
        (expr.as<CallExpression>().getSubroutineKind() == SubroutineKind::Task &&
         expr.type->isVoid())) {
        context.addDiag(diag::VoidCastFuncCall, expr.sourceRange);
        return badStmt(compilation, result);
    }

    if (expr.type->isVoid()) {
        context.addDiag(diag::PointlessVoidCast, expr.sourceRange)
            << expr.as<CallExpression>().getSubroutineName();
    }

    return *result;
}